

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall
Json::valueToQuotedString_abi_cxx11_(string *__return_storage_ptr__,Json *this,char *value)

{
  Json JVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  void *this_00;
  undefined8 uVar5;
  string local_230 [32];
  int local_210;
  char local_209;
  ostringstream local_208 [8];
  ostringstream oss;
  Json *local_90;
  char *c;
  size_type maxsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_19;
  Json *local_18;
  char *value_local;
  string *result;
  
  local_18 = this;
  value_local = (char *)__return_storage_ptr__;
  if (this == (Json *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pcVar3 = strpbrk((char *)this,"\"\\\b\f\n\r\t");
    if ((pcVar3 != (char *)0x0) || (bVar2 = containsControlCharacter((char *)local_18), bVar2)) {
      strlen((char *)local_18);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      for (local_90 = local_18; *local_90 != (Json)0x0; local_90 = local_90 + 1) {
        JVar1 = *local_90;
        if (JVar1 == (Json)0x8) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
        }
        else if (JVar1 == (Json)0x9) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
        }
        else if (JVar1 == (Json)0xa) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
        }
        else if (JVar1 == (Json)0xc) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
        }
        else if (JVar1 == (Json)0xd) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
        }
        else if (JVar1 == (Json)0x22) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
        }
        else if (JVar1 == (Json)0x5c) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
        }
        else {
          bVar2 = isControlCharacter((char)*local_90);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_208);
            poVar4 = std::operator<<((ostream *)local_208,"\\u");
            this_00 = (void *)std::ostream::operator<<(poVar4,std::hex);
            uVar5 = std::ostream::operator<<(this_00,std::uppercase);
            local_209 = (char)std::setfill<char>('0');
            poVar4 = std::operator<<(uVar5,local_209);
            local_210 = (int)std::setw(4);
            poVar4 = std::operator<<(poVar4,(_Setw)local_210);
            std::ostream::operator<<(poVar4,(int)(char)*local_90);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_230);
            std::__cxx11::string::~string(local_230);
            std::__cxx11::ostringstream::~ostringstream(local_208);
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)*local_90);
          }
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"\"",(allocator *)((long)&maxsize + 7));
      std::operator+(&local_50,&local_70,(char *)local_18);
      std::operator+(__return_storage_ptr__,&local_50,"\"");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&maxsize + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING valueToQuotedString(const char* value) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strpbrk(value, "\"\\\b\f\n\r\t") == NULL &&
      !containsControlCharacter(value))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      strlen(value) * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  for (const char* c = value; *c != 0; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if (isControlCharacter(*c)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}